

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

void __thiscall
kj::Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_>::Table
          (Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *this)

{
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 **)(this + 0x18) = &NullArrayDisposer::instance;
  _::BTreeImpl::BTreeImpl((BTreeImpl *)(this + 0x28));
  return;
}

Assistant:

Table<Row, Indexes...>::Table() {}